

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O1

string * __thiscall
Dashel::IPV4Address::format_abi_cxx11_
          (string *__return_storage_ptr__,IPV4Address *this,bool resolveName)

{
  uint uVar1;
  in_addr __in;
  hostent *phVar2;
  size_t sVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  uint a2;
  ostringstream buf;
  undefined1 auStack_1a8 [12];
  in_addr local_19c;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  uVar1 = this->address;
  local_19c.s_addr = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  if ((int)CONCAT71(in_register_00000011,resolveName) != 0) {
    phVar2 = gethostbyaddr(&local_19c,4,2);
    if (phVar2 != (hostent *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"tcp:host=",9);
      pcVar4 = phVar2->h_name;
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)auStack_1a8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x10);
      }
      else {
        sVar3 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,";port=",6);
      std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      std::__cxx11::stringbuf::str();
      goto LAB_001181de;
    }
  }
  __in.s_addr = local_19c.s_addr;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"tcp:host=",9);
  pcVar4 = inet_ntoa(__in);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)auStack_1a8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x10);
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,";port=",6);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
LAB_001181de:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string IPV4Address::format(const bool resolveName) const
	{
		std::ostringstream buf;
		unsigned a2 = htonl(address);

		if (resolveName)
		{
			struct hostent* he = gethostbyaddr((const char*)&a2, 4, AF_INET);
			if (he != NULL)
			{
				buf << "tcp:host=" << he->h_name << ";port=" << port;
				return buf.str();
			}
		}

		struct in_addr addr;
		addr.s_addr = a2;
		buf << "tcp:host=" << inet_ntoa(addr) << ";port=" << port;
		return buf.str();
	}